

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.hpp
# Opt level: O0

parameter_trie_ptr __thiscall
boost::runtime::cla::rt_cla_detail::parameter_trie::get_subtrie(parameter_trie *this,char c)

{
  bool bVar1;
  sp_counted_base *extraout_RDX;
  sp_counted_base *extraout_RDX_00;
  shared_count sVar2;
  element_type *in_RDI;
  parameter_trie_ptr pVar3;
  const_iterator it;
  shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie> *in_stack_ffffffffffffffb8;
  element_type *this_00;
  _Self local_28;
  _Self local_20 [4];
  
  this_00 = in_RDI;
  local_20[0]._M_node =
       (_Base_ptr)
       std::
       map<char,_boost::shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>,_std::less<char>,_std::allocator<std::pair<const_char,_boost::shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>_>_>_>
       ::find((map<char,_boost::shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>,_std::less<char>,_std::allocator<std::pair<const_char,_boost::shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>_>_>_>
               *)in_stack_ffffffffffffffb8,(key_type_conflict *)0x279575);
  local_28._M_node =
       (_Base_ptr)
       std::
       map<char,_boost::shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>,_std::less<char>,_std::allocator<std::pair<const_char,_boost::shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>_>_>_>
       ::end((map<char,_boost::shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>,_std::less<char>,_std::allocator<std::pair<const_char,_boost::shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>_>_>_>
              *)in_stack_ffffffffffffffb8);
  bVar1 = std::operator!=(local_20,&local_28);
  if (bVar1) {
    std::
    _Rb_tree_const_iterator<std::pair<const_char,_boost::shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>_>_>
    ::operator->((_Rb_tree_const_iterator<std::pair<const_char,_boost::shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>_>_>
                  *)0x2795a8);
    shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>::shared_ptr
              ((shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie> *)this_00,
               in_stack_ffffffffffffffb8);
    sVar2.pi_ = extraout_RDX;
  }
  else {
    shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>::shared_ptr
              ((shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie> *)0x2795c5);
    sVar2.pi_ = extraout_RDX_00;
  }
  pVar3.pn.pi_ = sVar2.pi_;
  pVar3.px = in_RDI;
  return pVar3;
}

Assistant:

parameter_trie_ptr  get_subtrie( char c ) const
    {
        trie_per_char::const_iterator it = m_subtrie.find( c );

        return it != m_subtrie.end() ? it->second : parameter_trie_ptr();
    }